

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

void * mdns_string_make(void *data,size_t capacity,char *name,size_t length)

{
  size_t sVar1;
  undefined1 *puVar2;
  ulong uVar3;
  ulong offset;
  size_t sVar4;
  
  offset = 0;
  sVar4 = capacity;
  do {
    uVar3 = length - offset;
    if (length < offset || uVar3 == 0) {
LAB_0025e7bc:
      if (sVar4 == 0) {
LAB_0025e7cc:
        puVar2 = (undefined1 *)0x0;
      }
      else {
        *(undefined1 *)data = 0;
        puVar2 = (undefined1 *)((long)data + 1);
      }
      return puVar2;
    }
    sVar1 = mdns_string_find(name,length,'.',offset);
    if (sVar1 == 0xffffffffffffffff) {
      if (capacity <= uVar3) goto LAB_0025e7cc;
      *(char *)data = (char)uVar3;
      memcpy((undefined1 *)((long)data + 1),name + offset,uVar3);
      data = (void *)((long)data + uVar3 + 1);
      sVar4 = sVar4 - (uVar3 + 1);
      goto LAB_0025e7bc;
    }
    uVar3 = sVar1 - offset;
    if (sVar4 <= uVar3) goto LAB_0025e7cc;
    *(char *)data = (char)uVar3;
    memcpy((undefined1 *)((long)data + 1),name + offset,uVar3);
    data = (void *)((long)data + uVar3 + 1);
    sVar4 = sVar4 - (uVar3 + 1);
    offset = sVar1 + 1;
  } while( true );
}

Assistant:

void*
mdns_string_make(void* data, size_t capacity, const char* name, size_t length) {
	size_t pos = 0;
	size_t last_pos = 0;
	size_t remain = capacity;
	unsigned char* dest = (unsigned char*)data;
	while ((last_pos < length) && ((pos = mdns_string_find(name, length, '.', last_pos)) != MDNS_INVALID_POS)) {
		size_t sublength = pos - last_pos;
		if (sublength < remain) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
		last_pos = pos + 1;
	}
	if (last_pos < length) {
		size_t sublength = length - last_pos;
		if (sublength < capacity) {
			*dest = (unsigned char)sublength;
			memcpy(dest + 1, name + last_pos, sublength);
			dest += sublength + 1;
			remain -= sublength + 1;
		}
		else {
			return 0;
		}
	}
	if (!remain)
		return 0;
	*dest++ = 0;
	return dest;
}